

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

string * format<std::__cxx11::string,std::__cxx11::string>
                   (string *__return_storage_ptr__,int fmt_num,string *fmt,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  string fmt_replaced;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_local;
  string *fmt_local;
  int fmt_num_local;
  
  fmt_replaced.field_2._8_8_ = args;
  std::__cxx11::string::string((string *)&local_70,(string *)arg);
  format<std::__cxx11::string>((string *)local_50,fmt_num,fmt,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_a0,(string *)args);
  format<std::__cxx11::string>(__return_storage_ptr__,fmt_num + 1,(string *)local_50,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

const std::string format (int fmt_num, const std::string& fmt, T arg, Args... args)
{
    const std::string fmt_replaced (format (fmt_num, fmt, arg));
    return format (fmt_num+1, fmt_replaced, args...);
}